

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<6UL>::GetDescriptor
          (SimpleTypeHandler<6UL> *this,PropertyId propertyId,PropertyIndex *index)

{
  int iVar1;
  bool bVar2;
  ushort uVar3;
  
  iVar1 = this->propertyCount;
  bVar2 = 0 < iVar1;
  if (0 < iVar1) {
    if ((this->descriptors[0].Id.ptr)->pid == propertyId) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      do {
        uVar3 = uVar3 + 1;
        bVar2 = (int)(uint)uVar3 < iVar1;
        if (iVar1 <= (int)(uint)uVar3) goto LAB_00e5c9b0;
      } while ((this->descriptors[uVar3].Id.ptr)->pid != propertyId);
    }
    *index = uVar3;
  }
LAB_00e5c9b0:
  return (BOOL)bVar2;
}

Assistant:

BOOL SimpleTypeHandler<size>::GetDescriptor(PropertyId propertyId, PropertyIndex * index)
    {
        for (PropertyIndex i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                *index = i;
                return true;
            }
        }
        return false;
    }